

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O1

TiffImageInfo * __thiscall
TIFFImageHandler::ReadImageInfo
          (TiffImageInfo *__return_storage_ptr__,TIFFImageHandler *this,
          IByteReaderWithPosition *inTIFFStream,unsigned_long inImageIndex)

{
  T2P *pTVar1;
  int iVar2;
  EStatusCode EVar3;
  undefined4 extraout_var;
  TIFF *tif;
  Trace *pTVar4;
  StreamWithPos streamInfo;
  
  (__return_storage_ptr__->dimensions).first = 0.0;
  (__return_storage_ptr__->dimensions).second = 0.0;
  (__return_storage_ptr__->dimensions).first = -1.0;
  (__return_storage_ptr__->dimensions).second = -1.0;
  __return_storage_ptr__->colorComponents = 0;
  TIFFSetErrorHandler(ReportError);
  TIFFSetWarningHandler(ReportWarning);
  streamInfo.mStream = inTIFFStream;
  iVar2 = (*(inTIFFStream->super_IByteReader)._vptr_IByteReader[6])(inTIFFStream);
  streamInfo.mOriginalPosition = CONCAT44(extraout_var,iVar2);
  tif = TIFFClientOpen("Stream","r",&streamInfo,STATIC_streamRead,STATIC_streamWrite,
                       STATIC_streamSeek,STATIC_streamClose,STATIC_tiffSize,STATIC_tiffMap,
                       STATIC_tiffUnmap);
  if (tif == (TIFF *)0x0) {
    pTVar4 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar4,"TIFFImageHandler::ReadImageDimensions. cannot open stream for reading"
                     );
  }
  else {
    InitializeConversionState(this);
    pTVar1 = this->mT2p;
    pTVar1->input = tif;
    std::__cxx11::string::_M_replace
              ((ulong)&pTVar1->inputFilePath,0,(char *)(pTVar1->inputFilePath)._M_string_length,
               0x339aaa);
    this->mT2p->pdf_page = (tdir_t)inImageIndex;
    EVar3 = ReadTopLevelTiffInformation(this);
    if (EVar3 == eSuccess) {
      if (this->mT2p->pdf_page < this->mT2p->tiff_pagecount) {
        EVar3 = ReadTIFFPageInformation(this);
        if (EVar3 == eSuccess) {
          pTVar1 = this->mT2p;
          (__return_storage_ptr__->dimensions).first =
               (double)((pTVar1->pdf_mediabox).x2 - (pTVar1->pdf_mediabox).x1);
          (__return_storage_ptr__->dimensions).second =
               (double)((pTVar1->pdf_mediabox).y2 - (pTVar1->pdf_mediabox).y1);
          __return_storage_ptr__->colorComponents = (uint)pTVar1->tiff_samplesperpixel;
        }
      }
      else {
        pTVar4 = Trace::DefaultTrace();
        pTVar1 = this->mT2p;
        Trace::TraceToLog(pTVar4,
                          "TIFFImageHandler::ReadImageDimensions, Requested tiff page %u where the tiff only has %u pages. Tiff file name - %s"
                          ,(ulong)pTVar1->pdf_page,(ulong)pTVar1->tiff_pagecount,
                          (pTVar1->inputFilePath)._M_dataplus._M_p);
      }
    }
  }
  DestroyConversionState(this);
  if (tif != (TIFF *)0x0) {
    TIFFClose(tif);
  }
  return __return_storage_ptr__;
}

Assistant:

TIFFImageHandler::TiffImageInfo TIFFImageHandler::ReadImageInfo(IByteReaderWithPosition* inTIFFStream,unsigned long inImageIndex)
{
	TIFF* input = NULL;
    TiffImageInfo imageInfo;
	
	imageInfo.dimensions.first = -1;
	imageInfo.dimensions.second = -1;
	imageInfo.colorComponents = 0;
    EStatusCode status;
    
	do
	{
		TIFFSetErrorHandler(ReportError);
		TIFFSetWarningHandler(ReportWarning);
        
		StreamWithPos streamInfo;
		streamInfo.mStream = inTIFFStream;
		streamInfo.mOriginalPosition = inTIFFStream->GetCurrentPosition();
		
		input = TIFFClientOpen("Stream","r",(thandle_t)&streamInfo,STATIC_streamRead,
                               STATIC_streamWrite,
                               STATIC_streamSeek,
                               STATIC_streamClose,
                               STATIC_tiffSize,
                               STATIC_tiffMap,
                               STATIC_tiffUnmap);
		if(!input)
		{
			TRACE_LOG("TIFFImageHandler::ReadImageDimensions. cannot open stream for reading");
			break;
		}
        
        
		InitializeConversionState();
		mT2p->input = input;
		mT2p->inputFilePath = "";
		mT2p->pdf_page = (tdir_t)inImageIndex;
        
        
        status = ReadTopLevelTiffInformation();
        if(status != PDFHummus::eSuccess)
            break;
            
        if(mT2p->pdf_page >= mT2p->tiff_pagecount)
        {
            TRACE_LOG3(
                           "TIFFImageHandler::ReadImageDimensions, Requested tiff page %u where the tiff only has %u pages. Tiff file name - %s",
                           mT2p->pdf_page,
                           mT2p->tiff_pagecount,
                           mT2p->inputFilePath.c_str());
            status = PDFHummus::eFailure;
            break;
        }
        
        status = ReadTIFFPageInformation();
        if(status != PDFHummus::eSuccess)
            break;
        imageInfo.dimensions.first = mT2p->pdf_mediabox.x2 - mT2p->pdf_mediabox.x1;
        imageInfo.dimensions.second = mT2p->pdf_mediabox.y2 - mT2p->pdf_mediabox.y1;
		imageInfo.colorComponents = mT2p->tiff_samplesperpixel;
		      
	}while(false);
    
	DestroyConversionState();
	if(input != NULL)
		TIFFClose(input);
    
    return imageInfo;
}